

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O3

gdIOCtx * gdNewDynamicCtxEx(int initialSize,void *data,int freeOKFlag)

{
  gdIOCtx *ptr;
  _func_int_gdIOCtx_ptr *ptr_00;
  void *pvVar1;
  
  ptr = (gdIOCtx *)gdMalloc(0x48);
  if (ptr != (gdIOCtx *)0x0) {
    ptr_00 = (_func_int_gdIOCtx_ptr *)gdMalloc(0x20);
    if (ptr_00 != (_func_int_gdIOCtx_ptr *)0x0) {
      if (data != (void *)0x0) {
        *(int *)(ptr_00 + 8) = initialSize;
        *(void **)ptr_00 = data;
LAB_0011b4d2:
        *(int *)(ptr_00 + 0xc) = initialSize;
        *(undefined8 *)(ptr_00 + 0x10) = 1;
        *(int *)(ptr_00 + 0x18) = freeOKFlag;
        ptr[1].getC = ptr_00;
        ptr->getC = dynamicGetchar;
        ptr->putC = dynamicPutchar;
        ptr->getBuf = dynamicGetbuf;
        ptr->putBuf = dynamicPutbuf;
        ptr->seek = dynamicSeek;
        ptr->tell = dynamicTell;
        ptr->gd_free = gdFreeDynamicCtx;
        return ptr;
      }
      *(undefined4 *)(ptr_00 + 8) = 0;
      *(undefined4 *)(ptr_00 + 0x10) = 0;
      pvVar1 = gdMalloc((long)initialSize);
      *(void **)ptr_00 = pvVar1;
      if (pvVar1 != (void *)0x0) goto LAB_0011b4d2;
      *(undefined4 *)(ptr_00 + 0xc) = 0;
      gdFree(ptr_00);
    }
    gdFree(ptr);
  }
  return (gdIOCtx *)0x0;
}

Assistant:

BGD_DECLARE(gdIOCtx *) gdNewDynamicCtxEx(int initialSize, void *data, int freeOKFlag)
{
	dpIOCtx *ctx;
	dynamicPtr *dp;

	ctx = (dpIOCtx *)gdMalloc(sizeof (dpIOCtx));
	if(ctx == NULL) {
		return NULL;
	}

	dp = newDynamic(initialSize, data, freeOKFlag);
	if(!dp) {
		gdFree (ctx);
		return NULL;
	};

	ctx->dp = dp;

	ctx->ctx.getC = dynamicGetchar;
	ctx->ctx.putC = dynamicPutchar;

	ctx->ctx.getBuf = dynamicGetbuf;
	ctx->ctx.putBuf = dynamicPutbuf;

	ctx->ctx.seek = dynamicSeek;
	ctx->ctx.tell = dynamicTell;

	ctx->ctx.gd_free = gdFreeDynamicCtx;

	return (gdIOCtx *)ctx;
}